

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeanLoader_impl.hpp
# Opt level: O1

void __thiscall
hiberlite::LoadBean::notifyInitWalk<hiberlite::AVisitor<hiberlite::LoadBean>>
          (LoadBean *this,AVisitor<hiberlite::LoadBean> *av)

{
  undefined8 *puVar1;
  int *piVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  pointer pcVar4;
  bool bVar5;
  long *plVar6;
  undefined8 *puVar7;
  runtime_error *this_00;
  size_type *psVar8;
  ulong *puVar9;
  long *plVar10;
  undefined8 uVar11;
  sqlid_t curId;
  SQLiteSelect sel;
  string query;
  shared_connection local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  size_type local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  SQLiteSelect local_188;
  string local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  undefined1 local_118 [16];
  undefined **local_108 [2];
  _Alloc_hider local_f8;
  shared_cnt_obj_pair<hiberlite::autoclosed_con> *local_f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8;
  int local_d8;
  long *local_d0;
  long local_c8;
  long local_c0;
  long lStack_b8;
  string local_b0;
  string local_90;
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if ((this->stmt).c.
      super__Deque_base<std::pair<hiberlite::SQLiteSelect,_long_long>,_std::allocator<std::pair<hiberlite::SQLiteSelect,_long_long>_>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_cur !=
      (this->stmt).c.
      super__Deque_base<std::pair<hiberlite::SQLiteSelect,_long_long>,_std::allocator<std::pair<hiberlite::SQLiteSelect,_long_long>_>_>
      ._M_impl.super__Deque_impl_data._M_start._M_cur) {
    do {
      std::
      deque<std::pair<hiberlite::SQLiteSelect,_long_long>,_std::allocator<std::pair<hiberlite::SQLiteSelect,_long_long>_>_>
      ::pop_back((deque<std::pair<hiberlite::SQLiteSelect,_long_long>,_std::allocator<std::pair<hiberlite::SQLiteSelect,_long_long>_>_>
                  *)this);
    } while ((this->stmt).c.
             super__Deque_base<std::pair<hiberlite::SQLiteSelect,_long_long>,_std::allocator<std::pair<hiberlite::SQLiteSelect,_long_long>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur !=
             (this->stmt).c.
             super__Deque_base<std::pair<hiberlite::SQLiteSelect,_long_long>,_std::allocator<std::pair<hiberlite::SQLiteSelect,_long_long>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur);
  }
  local_1b0 = (av->rootKey).id;
  pcVar4 = (av->scope)._table._M_dataplus._M_p;
  local_118._0_8_ = local_108;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_118,pcVar4,pcVar4 + (av->scope)._table._M_string_length);
  pcVar4 = (av->scope)._prefix._M_dataplus._M_p;
  local_f8._M_p = (pointer)&local_e8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f8,pcVar4,pcVar4 + (av->scope)._prefix._M_string_length);
  local_d8 = (av->scope).prefix_depth;
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_70,local_118._0_8_,
             (pointer)(local_118._0_8_ + CONCAT71(local_118._9_7_,local_118[8])));
  plVar6 = (long *)std::__cxx11::string::replace((ulong)local_70,0,(char *)0x0,0x1a6295);
  local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
  psVar8 = (size_type *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar8) {
    local_1a8.field_2._M_allocated_capacity = *psVar8;
    local_1a8.field_2._8_8_ = plVar6[3];
  }
  else {
    local_1a8.field_2._M_allocated_capacity = *psVar8;
    local_1a8._M_dataplus._M_p = (pointer)*plVar6;
  }
  local_1a8._M_string_length = plVar6[1];
  *plVar6 = (long)psVar8;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_1a8);
  local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
  psVar8 = (size_type *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar8) {
    local_158.field_2._M_allocated_capacity = *psVar8;
    local_158.field_2._8_8_ = plVar6[3];
  }
  else {
    local_158.field_2._M_allocated_capacity = *psVar8;
    local_158._M_dataplus._M_p = (pointer)*plVar6;
  }
  local_158._M_string_length = plVar6[1];
  *plVar6 = (long)psVar8;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_158);
  local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
  psVar8 = (size_type *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar8) {
    local_138.field_2._M_allocated_capacity = *psVar8;
    local_138.field_2._8_8_ = plVar6[3];
  }
  else {
    local_138.field_2._M_allocated_capacity = *psVar8;
    local_138._M_dataplus._M_p = (pointer)*plVar6;
  }
  local_138._M_string_length = plVar6[1];
  *plVar6 = (long)psVar8;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_138);
  paVar3 = &local_1d0.field_2;
  puVar9 = (ulong *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar9) {
    local_1d0.field_2._M_allocated_capacity = *puVar9;
    local_1d0.field_2._8_8_ = plVar6[3];
    local_1d0._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_1d0.field_2._M_allocated_capacity = *puVar9;
    local_1d0._M_dataplus._M_p = (pointer)*plVar6;
  }
  local_1d0._M_string_length = plVar6[1];
  *plVar6 = (long)puVar9;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  Transformer::toSQLiteValue_abi_cxx11_
            (&local_b0,(Transformer *)&local_1b0,(longlong *)local_1d0._M_string_length);
  uVar11 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != paVar3) {
    uVar11 = local_1d0.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar11 < local_b0._M_string_length + local_1d0._M_string_length) {
    uVar11 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      uVar11 = local_b0.field_2._M_allocated_capacity;
    }
    if (local_b0._M_string_length + local_1d0._M_string_length <= (ulong)uVar11) {
      puVar7 = (undefined8 *)
               std::__cxx11::string::replace
                         ((ulong)&local_b0,0,(char *)0x0,(ulong)local_1d0._M_dataplus._M_p);
      goto LAB_001214cb;
    }
  }
  puVar7 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_1d0,(ulong)local_b0._M_dataplus._M_p);
LAB_001214cb:
  local_188._vptr_SQLiteSelect = (_func_int **)&local_188.statement;
  puVar1 = puVar7 + 2;
  if ((shared_stmt *)*puVar7 == (shared_stmt *)puVar1) {
    local_188.statement._vptr_shared_res = (_func_int **)*puVar1;
    local_188.statement.res = (shared_cnt_obj_pair<hiberlite::statement_ptr> *)puVar7[3];
  }
  else {
    local_188.statement._vptr_shared_res = (_func_int **)*puVar1;
    local_188._vptr_SQLiteSelect = (_func_int **)*puVar7;
  }
  local_188._8_8_ = puVar7[1];
  *puVar7 = puVar1;
  puVar7[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_188);
  local_d0 = &local_c0;
  plVar10 = plVar6 + 2;
  if ((long *)*plVar6 == plVar10) {
    local_c0 = *plVar10;
    lStack_b8 = plVar6[3];
  }
  else {
    local_c0 = *plVar10;
    local_d0 = (long *)*plVar6;
  }
  local_c8 = plVar6[1];
  *plVar6 = (long)plVar10;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  if ((shared_stmt *)local_188._vptr_SQLiteSelect != &local_188.statement) {
    operator_delete(local_188._vptr_SQLiteSelect);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != paVar3) {
    operator_delete(local_1d0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != &local_138.field_2) {
    operator_delete(local_138._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != &local_158.field_2) {
    operator_delete(local_158._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
    operator_delete(local_1a8._M_dataplus._M_p);
  }
  if (local_70[0] != local_60) {
    operator_delete(local_70[0]);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_p != &local_e8) {
    operator_delete(local_f8._M_p);
  }
  if ((undefined ***)local_118._0_8_ != local_108) {
    operator_delete((void *)local_118._0_8_);
  }
  local_1e0._vptr_shared_res = (_func_int **)&PTR__shared_res_001d4578;
  local_1e0.res = (av->rootKey).con.res;
  if (local_1e0.res != (shared_cnt_obj_pair<hiberlite::autoclosed_con> *)0x0) {
    (local_1e0.res)->refCount = (local_1e0.res)->refCount + 1;
  }
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_90,local_d0,local_c8 + (long)local_d0);
  SQLiteSelect::SQLiteSelect(&local_188,&local_1e0,&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  local_1e0._vptr_shared_res = (_func_int **)&PTR__shared_res_001d4578;
  if (local_1e0.res != (shared_cnt_obj_pair<hiberlite::autoclosed_con> *)0x0) {
    piVar2 = &(local_1e0.res)->refCount;
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      (*(local_1e0.res)->_vptr_shared_cnt_obj_pair[1])();
    }
  }
  bVar5 = SQLiteSelect::step(&local_188);
  if (bVar5) {
    local_118._0_8_ = &PTR__SQLiteSelect_001d4a60;
    local_118[8] = local_188.active;
    local_108[0] = &PTR__shared_res_001d46d0;
    local_108[1] = (undefined **)local_188.statement.res;
    if (local_188.statement.res != (shared_cnt_obj_pair<hiberlite::statement_ptr> *)0x0) {
      (local_188.statement.res)->refCount = (local_188.statement.res)->refCount + 1;
    }
    local_f8._M_p = (pointer)&PTR__shared_res_001d4578;
    local_f0 = local_188.con.res;
    if (local_188.con.res != (shared_cnt_obj_pair<hiberlite::autoclosed_con> *)0x0) {
      (local_188.con.res)->refCount = (local_188.con.res)->refCount + 1;
    }
    local_e8._M_allocated_capacity = local_1b0;
    std::
    deque<std::pair<hiberlite::SQLiteSelect,long_long>,std::allocator<std::pair<hiberlite::SQLiteSelect,long_long>>>
    ::emplace_back<std::pair<hiberlite::SQLiteSelect,long_long>>
              ((deque<std::pair<hiberlite::SQLiteSelect,long_long>,std::allocator<std::pair<hiberlite::SQLiteSelect,long_long>>>
                *)this,(pair<hiberlite::SQLiteSelect,_long_long> *)local_118);
    SQLiteSelect::~SQLiteSelect((SQLiteSelect *)local_118);
    SQLiteSelect::~SQLiteSelect(&local_188);
    if (local_d0 != &local_c0) {
      operator_delete(local_d0);
    }
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::to_string(&local_158,local_1b0);
  std::operator+(&local_138,"Id ",&local_158);
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_138);
  local_1d0._M_dataplus._M_p = (pointer)*plVar6;
  psVar8 = (size_type *)(plVar6 + 2);
  if ((size_type *)local_1d0._M_dataplus._M_p == psVar8) {
    local_1d0.field_2._M_allocated_capacity = *psVar8;
    local_1d0.field_2._8_8_ = plVar6[3];
    local_1d0._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_1d0.field_2._M_allocated_capacity = *psVar8;
  }
  local_1d0._M_string_length = plVar6[1];
  *plVar6 = (long)psVar8;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  AVisitor<hiberlite::LoadBean>::getScope((Scope *)local_118,av);
  local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1a8,local_118._0_8_,
             (pointer)(local_118._0_8_ + CONCAT71(local_118._9_7_,local_118[8])));
  std::operator+(&local_50,&local_1d0,&local_1a8);
  std::runtime_error::runtime_error(this_00,(string *)&local_50);
  *(undefined ***)this_00 = &PTR__runtime_error_001d46a8;
  __cxa_throw(this_00,&database_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void LoadBean::notifyInitWalk(AV& av)
{
	while(!stmt.empty())
		stmt.pop();

	sqlid_t curId=av.getRootId();

	std::string query="SELECT * FROM "+av.getScope().table()
						+" WHERE "+HIBERLITE_PRIMARY_KEY_COLUMN+"="+Transformer::toSQLiteValue(curId)+";";

	SQLiteSelect sel(av.getConnection(), query);
	if(!sel.step())
		throw database_error("Id " + std::to_string(curId) + " not found in table " + av.getScope().table());
	stmt.push( std::make_pair(sel,curId) );
}